

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

Value __thiscall
Fossilize::uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (Fossilize *this,uint64_t value,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  size_t sVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  Value VVar2;
  char str [17];
  StringRefType local_48;
  char local_38 [24];
  
  sprintf(local_38,"%016lx",value);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  local_48.s = local_38;
  sVar1 = strlen(local_38);
  local_48.length = (SizeType)sVar1;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  SetStringRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this,&local_48,alloc);
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)extraout_RAX;
  return (Value)VVar2.data_;
}

Assistant:

static Value uint64_string(uint64_t value, Allocator &alloc)
{
	char str[17]; // 16 digits + null
	sprintf(str, "%016" PRIx64, value);
	return Value(str, alloc);
}